

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveLleftForest(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *eps,
                  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *vec,int *nonz,int n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  fpclass_type fVar4;
  int32_t iVar5;
  pointer pnVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  cpp_dec_float<200U,_int,_void> *pcVar10;
  cpp_dec_float<200U,_int,_void> *pcVar11;
  type_conflict5 tVar12;
  bool bVar13;
  int *piVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  cpp_dec_float<200U,_int,_void> *pcVar19;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar21;
  cpp_dec_float<200U,_int,_void> *pcVar22;
  cpp_dec_float<200U,_int,_void> *pcVar23;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar24;
  byte bVar25;
  int local_3a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<200U,_int,_void> local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<200U,_int,_void> local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar25 = 0;
  local_2b8.fpclass = cpp_dec_float_finite;
  local_2b8.prec_elem = 0x1c;
  local_2b8.data._M_elems[0] = 0;
  local_2b8.data._M_elems[1] = 0;
  local_2b8.data._M_elems[2] = 0;
  local_2b8.data._M_elems[3] = 0;
  local_2b8.data._M_elems[4] = 0;
  local_2b8.data._M_elems[5] = 0;
  local_2b8.data._M_elems[6] = 0;
  local_2b8.data._M_elems[7] = 0;
  local_2b8.data._M_elems[8] = 0;
  local_2b8.data._M_elems[9] = 0;
  local_2b8.data._M_elems[10] = 0;
  local_2b8.data._M_elems[0xb] = 0;
  local_2b8.data._M_elems[0xc] = 0;
  local_2b8.data._M_elems[0xd] = 0;
  local_2b8.data._M_elems[0xe] = 0;
  local_2b8.data._M_elems[0xf] = 0;
  local_2b8.data._M_elems[0x10] = 0;
  local_2b8.data._M_elems[0x11] = 0;
  local_2b8.data._M_elems[0x12] = 0;
  local_2b8.data._M_elems[0x13] = 0;
  local_2b8.data._M_elems[0x14] = 0;
  local_2b8.data._M_elems[0x15] = 0;
  local_2b8.data._M_elems[0x16] = 0;
  local_2b8.data._M_elems[0x17] = 0;
  local_2b8.data._M_elems[0x18] = 0;
  local_2b8.data._M_elems[0x19] = 0;
  local_2b8.data._M_elems._104_5_ = 0;
  local_2b8.data._M_elems[0x1b]._1_3_ = 0;
  local_2b8.exp = 0;
  local_2b8.neg = false;
  pnVar6 = (this->l).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar7 = (this->l).idx;
  piVar8 = (this->l).row;
  piVar9 = (this->l).start;
  iVar1 = (this->l).firstUpdate;
  lVar18 = (long)(this->l).firstUnused;
  while( true ) {
    lVar17 = lVar18;
    lVar16 = 0x1c;
    if (lVar17 <= iVar1) break;
    iVar2 = piVar8[lVar17 + -1];
    lVar18 = lVar17 + -1;
    pnVar20 = vec + iVar2;
    pcVar19 = &local_1b0;
    for (; lVar16 != 0; lVar16 = lVar16 + -1) {
      (((cpp_dec_float<200U,_int,_void> *)&pcVar19->data)->data)._M_elems[0] =
           (pnVar20->m_backend).data._M_elems[0];
      pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar20 + ((ulong)bVar25 * -2 + 1) * 4);
      pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + ((ulong)bVar25 * -2 + 1) * 4);
    }
    local_1b0.exp = vec[iVar2].m_backend.exp;
    local_1b0.neg = vec[iVar2].m_backend.neg;
    local_1b0.fpclass = vec[iVar2].m_backend.fpclass;
    local_1b0.prec_elem = vec[iVar2].m_backend.prec_elem;
    result_1.m_backend.data._M_elems[0] = 0;
    result_1.m_backend.data._M_elems[1] = 0;
    tVar12 = boost::multiprecision::operator!=
                       ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_1b0,(double *)&result_1);
    if (tVar12) {
      iVar2 = piVar9[lVar18];
      piVar14 = piVar7 + iVar2;
      pcVar19 = &pnVar6[iVar2].m_backend;
      iVar15 = piVar9[lVar17];
      local_3a0 = n;
      while( true ) {
        lVar16 = 0x1c;
        n = local_3a0;
        if (iVar15 <= iVar2) break;
        iVar3 = *piVar14;
        pnVar20 = vec + iVar3;
        pnVar21 = pnVar20;
        pcVar22 = &local_2b8;
        for (lVar17 = lVar16; lVar17 != 0; lVar17 = lVar17 + -1) {
          (pcVar22->data)._M_elems[0] = (pnVar21->m_backend).data._M_elems[0];
          pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar21 + ((ulong)bVar25 * -2 + 1) * 4);
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar25 * -8 + 4);
        }
        local_2b8.exp = vec[iVar3].m_backend.exp;
        local_2b8.neg = vec[iVar3].m_backend.neg;
        local_2b8.fpclass = vec[iVar3].m_backend.fpclass;
        local_2b8.prec_elem = vec[iVar3].m_backend.prec_elem;
        result_1.m_backend.data._M_elems._0_8_ =
             result_1.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
        tVar12 = boost::multiprecision::operator==
                           ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_2b8,(int *)&result_1.m_backend);
        if (tVar12) {
          pcVar22 = &local_1b0;
          pnVar21 = &result;
          for (; lVar16 != 0; lVar16 = lVar16 + -1) {
            (pnVar21->m_backend).data._M_elems[0] = (pcVar22->data)._M_elems[0];
            pcVar22 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar22 + ((ulong)bVar25 * -2 + 1) * 4);
            pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar21 + ((ulong)bVar25 * -2 + 1) * 4);
          }
          result.m_backend.exp = local_1b0.exp;
          result.m_backend.neg = local_1b0.neg;
          result.m_backend.fpclass = local_1b0.fpclass;
          result.m_backend.prec_elem = local_1b0.prec_elem;
          if (local_1b0.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0) {
            result.m_backend.neg = (bool)(local_1b0.neg ^ 1);
          }
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 0x1c;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems[6] = 0;
          result_1.m_backend.data._M_elems[7] = 0;
          result_1.m_backend.data._M_elems[8] = 0;
          result_1.m_backend.data._M_elems[9] = 0;
          result_1.m_backend.data._M_elems[10] = 0;
          result_1.m_backend.data._M_elems[0xb] = 0;
          result_1.m_backend.data._M_elems[0xc] = 0;
          result_1.m_backend.data._M_elems[0xd] = 0;
          result_1.m_backend.data._M_elems[0xe] = 0;
          result_1.m_backend.data._M_elems[0xf] = 0;
          result_1.m_backend.data._M_elems[0x10] = 0;
          result_1.m_backend.data._M_elems[0x11] = 0;
          result_1.m_backend.data._M_elems[0x12] = 0;
          result_1.m_backend.data._M_elems[0x13] = 0;
          result_1.m_backend.data._M_elems[0x14] = 0;
          result_1.m_backend.data._M_elems[0x15] = 0;
          result_1.m_backend.data._M_elems[0x16] = 0;
          result_1.m_backend.data._M_elems[0x17] = 0;
          result_1.m_backend.data._M_elems[0x18] = 0;
          result_1.m_backend.data._M_elems[0x19] = 0;
          result_1.m_backend.data._M_elems._104_5_ = 0;
          result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result_1.m_backend,&result.m_backend,pcVar19);
          lVar16 = 0x1c;
          pcVar22 = &result_1.m_backend;
          pcVar23 = &local_2b8;
          for (lVar17 = lVar16; lVar17 != 0; lVar17 = lVar17 + -1) {
            (pcVar23->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
            pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar25 * -8 + 4);
            pcVar23 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar23 + ((ulong)bVar25 * -2 + 1) * 4);
          }
          local_2b8.exp = result_1.m_backend.exp;
          local_2b8.neg = result_1.m_backend.neg;
          fVar4 = result_1.m_backend.fpclass;
          iVar5 = result_1.m_backend.prec_elem;
          local_2b8.fpclass = result_1.m_backend.fpclass;
          local_2b8.prec_elem = result_1.m_backend.prec_elem;
          pcVar22 = &local_2b8;
          pnVar21 = &local_130;
          for (lVar17 = lVar16; lVar17 != 0; lVar17 = lVar17 + -1) {
            (pnVar21->m_backend).data._M_elems[0] = (pcVar22->data)._M_elems[0];
            pcVar22 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar22 + ((ulong)bVar25 * -2 + 1) * 4);
            pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar21 + ((ulong)bVar25 * -2 + 1) * 4);
          }
          local_130.m_backend.exp = result_1.m_backend.exp;
          local_130.m_backend.neg = result_1.m_backend.neg;
          local_130.m_backend.fpclass = fVar4;
          local_130.m_backend.prec_elem = iVar5;
          pnVar21 = eps;
          pnVar24 = &local_b0;
          for (lVar17 = lVar16; lVar17 != 0; lVar17 = lVar17 + -1) {
            (pnVar24->m_backend).data._M_elems[0] = (pnVar21->m_backend).data._M_elems[0];
            pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar21 + ((ulong)bVar25 * -2 + 1) * 4);
            pnVar24 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar24 + ((ulong)bVar25 * -2 + 1) * 4);
          }
          local_b0.m_backend.exp = (eps->m_backend).exp;
          local_b0.m_backend.neg = (eps->m_backend).neg;
          local_b0.m_backend.fpclass = (eps->m_backend).fpclass;
          local_b0.m_backend.prec_elem = (eps->m_backend).prec_elem;
          bVar13 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             (&local_130,&local_b0);
          if (bVar13) {
            pcVar22 = &local_2b8;
            pnVar21 = pnVar20;
            for (; lVar16 != 0; lVar16 = lVar16 + -1) {
              (pnVar21->m_backend).data._M_elems[0] = (pcVar22->data)._M_elems[0];
              pcVar22 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar22 + ((ulong)bVar25 * -2 + 1) * 4);
              pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar21 + ((ulong)bVar25 * -2 + 1) * 4);
            }
            (pnVar20->m_backend).exp = local_2b8.exp;
            (pnVar20->m_backend).neg = local_2b8.neg;
            (pnVar20->m_backend).fpclass = local_2b8.fpclass;
            (pnVar20->m_backend).prec_elem = local_2b8.prec_elem;
            lVar16 = (long)local_3a0;
            local_3a0 = local_3a0 + 1;
            nonz[lVar16] = iVar3;
          }
        }
        else {
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 0x1c;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems[6] = 0;
          result_1.m_backend.data._M_elems[7] = 0;
          result_1.m_backend.data._M_elems[8] = 0;
          result_1.m_backend.data._M_elems[9] = 0;
          result_1.m_backend.data._M_elems[10] = 0;
          result_1.m_backend.data._M_elems[0xb] = 0;
          result_1.m_backend.data._M_elems[0xc] = 0;
          result_1.m_backend.data._M_elems[0xd] = 0;
          result_1.m_backend.data._M_elems[0xe] = 0;
          result_1.m_backend.data._M_elems[0xf] = 0;
          result_1.m_backend.data._M_elems[0x10] = 0;
          result_1.m_backend.data._M_elems[0x11] = 0;
          result_1.m_backend.data._M_elems[0x12] = 0;
          result_1.m_backend.data._M_elems[0x13] = 0;
          result_1.m_backend.data._M_elems[0x14] = 0;
          result_1.m_backend.data._M_elems[0x15] = 0;
          result_1.m_backend.data._M_elems[0x16] = 0;
          result_1.m_backend.data._M_elems[0x17] = 0;
          result_1.m_backend.data._M_elems[0x18] = 0;
          result_1.m_backend.data._M_elems[0x19] = 0;
          result_1.m_backend.data._M_elems._104_5_ = 0;
          result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result_1.m_backend,&local_1b0,pcVar19);
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&local_2b8,&result_1.m_backend);
          result.m_backend.data._M_elems[0] = 0;
          tVar12 = boost::multiprecision::operator!=
                             ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_2b8,(int *)&result);
          if (tVar12) {
            pcVar22 = &local_2b8;
            pcVar23 = &result_1.m_backend;
            for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
              (pcVar23->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
              pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar25 * -8 + 4);
              pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar25 * -8 + 4);
            }
            pcVar22 = &local_2b8;
            pcVar23 = &local_2b8;
            pcVar10 = &local_2b8;
            pcVar11 = &local_2b8;
          }
          else {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                      (&result_1.m_backend,1e-100,(type *)0x0);
            pcVar22 = &result_1.m_backend;
            pcVar23 = &result_1.m_backend;
            pcVar10 = &result_1.m_backend;
            pcVar11 = &result_1.m_backend;
          }
          iVar3 = pcVar22->exp;
          bVar13 = pcVar23->neg;
          fVar4 = pcVar10->fpclass;
          iVar5 = pcVar11->prec_elem;
          pcVar22 = &result_1.m_backend;
          pnVar21 = pnVar20;
          for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
            (pnVar21->m_backend).data._M_elems[0] = (pcVar22->data)._M_elems[0];
            pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar25 * -8 + 4);
            pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar21 + ((ulong)bVar25 * -2 + 1) * 4);
          }
          (pnVar20->m_backend).exp = iVar3;
          (pnVar20->m_backend).neg = bVar13;
          (pnVar20->m_backend).fpclass = fVar4;
          (pnVar20->m_backend).prec_elem = iVar5;
        }
        piVar14 = piVar14 + 1;
        pcVar19 = pcVar19 + 1;
        iVar15 = iVar15 + -1;
      }
    }
  }
  return n;
}

Assistant:

int CLUFactor<R>::solveLleftForest(R eps, R* vec, int* nonz, int n)
{
   int i, j, k, end;
   R x, y;
   R* val, *lval;
   int* idx, *lidx, *lrow, *lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;
   end = l.firstUpdate;

   for(i = l.firstUnused - 1; i >= end; --i)
   {
      assert(i >= 0 && i < l.size);

      if((x = vec[lrow[i]]) != 0.0)
      {
         k = lbeg[i];
         assert(k >= 0 && k < l.size);
         val = &lval[k];
         idx = &lidx[k];

         for(j = lbeg[i + 1]; j > k; --j)
         {
            int m = *idx++;
            assert(m >= 0 && m < thedim);
            y = vec[m];

            if(y == 0)
            {
               y = -x * (*val++);

               if(isNotZero(y, eps))
               {
                  vec[m] = y;
                  nonz[n++] = m;
               }
            }
            else
            {
               y -= x * (*val++);
               vec[m] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
            }
         }
      }
   }

   return n;
}